

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

bool __thiscall sptk::reaper::EpochTracker::WriteDiagnostics(EpochTracker *this,string *file_base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pTVar4;
  bool bVar5;
  uint uVar6;
  FILE *__s;
  float *pfVar7;
  long lVar8;
  char *__format;
  long lVar9;
  long lVar10;
  float fVar11;
  string pm_name;
  vector<float,_std::allocator<float>_> f0;
  float time;
  string local_98;
  vector<float,_std::allocator<float>_> local_78;
  ulong local_58;
  string local_50;
  
  if (file_base->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->debug_name_);
  }
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"pcm","");
  WriteDebugData(this,&this->signal_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"resid","");
  WriteDebugData(this,&this->residual_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"nresid","");
  WriteDebugData(this,&this->norm_residual_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"bprms","");
  WriteDebugData(this,&this->bandpassed_rms_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"onsetp","");
  WriteDebugData(this,&this->voice_onset_prob_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"offsetp","");
  WriteDebugData(this,&this->voice_offset_prob_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"pvals","");
  WriteDebugData(this,&this->peaks_debug_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"pvoiced","");
  WriteDebugData(this,&this->prob_voiced_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"bestcorr","");
  WriteDebugData(this,&this->best_corr_,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  sVar2 = (this->debug_name_)._M_string_length;
  if ((sVar2 != 0) &&
     (0x20 < (ulong)((long)(this->output_).
                           super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->output_).
                          super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                          ._M_impl.super__Vector_impl_data._M_start))) {
    pcVar3 = (this->debug_name_)._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar3,pcVar3 + sVar2);
    std::__cxx11::string::append((char *)&local_98);
    __s = fopen(local_98._M_dataplus._M_p,"w");
    fwrite("#\n",2,1,__s);
    local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (float *)0x0;
    local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (float *)0x0;
    uVar6 = (int)((ulong)((long)(this->output_).
                                super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->output_).
                               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
    if (-1 < (int)uVar6) {
      local_58 = (ulong)uVar6;
      lVar8 = local_58 << 4;
      lVar9 = local_58 + 1;
      do {
        pTVar4 = (this->output_).
                 super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar11 = (float)*(int *)((long)&pTVar4->resid_index + lVar8) / this->sample_rate_;
        local_50._M_dataplus._M_p._0_4_ = fVar11;
        __format = "%f blue \n";
        if (((&pTVar4->voiced)[lVar8] == false) &&
           (((long)local_58 <= lVar9 + -1 ||
            (__format = "%f blue \n", (&pTVar4[1].voiced)[lVar8] == false)))) {
          __format = "%f red \n";
        }
        fprintf(__s,__format,SUB84((double)fVar11,0));
        if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,(float *)&local_50);
        }
        else {
          *local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = local_50._M_dataplus._M_p._0_4_;
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        pfVar7 = (float *)((long)&((this->output_).
                                   super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->f0 + lVar8);
        if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,pfVar7);
        }
        else {
          *local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = *pfVar7;
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        pfVar7 = (float *)((long)&((this->output_).
                                   super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->nccf_value + lVar8);
        if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,pfVar7);
        }
        else {
          *local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = *pfVar7;
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        lVar8 = lVar8 + -0x10;
        lVar10 = lVar9 + -1;
        bVar5 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar5);
    }
    fclose(__s);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"f0ap","");
    WriteDebugData(this,&local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  return true;
}

Assistant:

bool EpochTracker::WriteDiagnostics(const std::string& file_base) {
  if (!file_base.empty()) {
    set_debug_name(file_base);
  }
  WriteDebugData(signal_, "pcm");
  WriteDebugData(residual_, "resid");
  WriteDebugData(norm_residual_, "nresid");
  WriteDebugData(bandpassed_rms_, "bprms");
  WriteDebugData(voice_onset_prob_, "onsetp");
  WriteDebugData(voice_offset_prob_, "offsetp");
  WriteDebugData(peaks_debug_, "pvals");
  WriteDebugData(prob_voiced_, "pvoiced");
  // best_corr_ is only available after CreatePeriodLattice.
  WriteDebugData(best_corr_, "bestcorr");
  // NOTE: if WriteDiagnostics is called before the
  // DynamicProgramming, there will be nothing in output_.
  if ((!debug_name_.empty()) && (output_.size() > 2)) {
    std::string pm_name = debug_name_ + ".pmlab";
    FILE* pmfile = fopen(pm_name.c_str(), "w");
    fprintf(pmfile, "#\n");
    std::vector<float> f0;
    int32_t limit = output_.size() - 1;
    // Produce debug output in normal time order.
    for (int32_t i = limit; i >= 0; --i) {
      float time = output_[i].resid_index / sample_rate_;
      // Note that the pulse locations of both the beginning and end
      // of any voiced period are of interest.
      if (output_[i].voiced || ((i < limit) && (output_[i+1].voiced))) {
        fprintf(pmfile, "%f blue \n", time);
      } else {
        fprintf(pmfile, "%f red \n", time);
      }
      f0.push_back(time);
      f0.push_back(output_[i].f0);
      f0.push_back(output_[i].nccf_value);
    }
    fclose(pmfile);
    WriteDebugData(f0, "f0ap");
  }
  return true;
}